

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void nh_ws_context_free(ws_context_t *ctx)

{
  char *pcVar1;
  
  pcVar1 = (ctx->stream).buf;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
    (ctx->stream).buf = (char *)0x0;
    (ctx->stream).length = 0;
    (ctx->stream).index = 0;
  }
  pcVar1 = (ctx->frame).payload;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  free(ctx);
  return;
}

Assistant:

void nh_ws_context_free(ws_context_t *ctx) {
    nh_stream_free(&ctx->stream);
    if (ctx->frame.payload != NULL) free(ctx->frame.payload);
    free(ctx);
}